

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mutex.c
# Opt level: O3

cf_errno_t cf_mutex_init(cf_mutex_t *mutex,cf_mutex_attr_t *attr)

{
  int iVar1;
  
  iVar1 = pthread_mutex_init((pthread_mutex_t *)mutex,(pthread_mutexattr_t *)attr);
  return (cf_errno_t)(iVar1 != 0);
}

Assistant:

cf_errno_t cf_mutex_init(cf_mutex_t* mutex, const cf_mutex_attr_t* attr) {
#ifdef CF_OS_WIN
    if (!mutex) return CF_EPARAM;
    *mutex = CreateMutex(NULL, FALSE, NULL);
    if (*mutex == NULL) return CF_NOK;
    else return CF_OK;
#else
    if(pthread_mutex_init(mutex, attr) == 0) return CF_OK;
    else return CF_NOK;
#endif
}